

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

bool str_suffix(char *astr,char *bstr)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(astr);
  sVar3 = strlen(bstr);
  if (((int)sVar2 <= (int)sVar3) &&
     (bVar1 = str_cmp(astr,bstr + ((long)(int)sVar3 - (long)(int)sVar2)), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool str_suffix(const char *astr, const char *bstr)
{
	int sstr1 = strlen(astr);
	int sstr2 = strlen(bstr);

	if (sstr1 <= sstr2 && !str_cmp(astr, bstr + sstr2 - sstr1))
		return false;
	else
		return true;
}